

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reversed_tests.cpp
# Opt level: O2

void __thiscall
omp_reversed_move_case_increase_values_Test::TestBody
          (omp_reversed_move_case_increase_values_Test *this)

{
  _List_iterator<int> __tmp;
  _List_node_base *__a;
  char *in_R9;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  AssertHelper AStack_a8;
  Message local_a0;
  reversed_container_adapter<std::__cxx11::list<int,_std::allocator<int>_>_> reversed_values;
  list<int,_std::allocator<int>_> values;
  string local_68;
  AssertionResult gtest_ar_;
  list<int,_std::allocator<int>_> expecting;
  reverse_iterator<std::_List_const_iterator<int>_> local_20;
  reverse_iterator<std::_List_const_iterator<int>_> local_18;
  
  local_68._M_dataplus._M_p = (pointer)0x400000001;
  local_68._M_string_length = 0x200000003;
  local_68.field_2._M_allocated_capacity._0_4_ = 5;
  __a = (_List_node_base *)&reversed_values;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_68;
  std::__cxx11::list<int,_std::allocator<int>_>::list(&values,__l,(allocator_type *)__a);
  reversed_values.container.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_next =
       values.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
       _M_next;
  reversed_values.container.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       values.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
       _M_prev;
  reversed_values.container.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
       values.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
  if (values.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
      _M_next == (_List_node_base *)&values) {
    reversed_values.container.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&reversed_values;
    reversed_values.container.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
    super__List_node_base._M_prev =
         reversed_values.container.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
         super__List_node_base._M_next;
  }
  else {
    (values.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
    _M_prev)->_M_next = __a;
    (values.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
    _M_next)->_M_prev = __a;
    values.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
    values.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next
         = (_List_node_base *)&values;
    values.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_prev
         = (_List_node_base *)&values;
  }
  local_68._M_dataplus._M_p = (char *)0x300000006;
  local_68._M_string_length = 0x500000004;
  local_68.field_2._M_allocated_capacity._0_4_ = 2;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_68;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            (&expecting,__l_00,(allocator_type *)&gtest_ar_);
  while (__a != reversed_values.container.super__List_base<int,_std::allocator<int>_>._M_impl.
                _M_node.super__List_node_base._M_next) {
    __a = __a->_M_prev;
    *(int *)&__a[1]._M_next = *(int *)&__a[1]._M_next + 1;
  }
  local_18.current._M_node = (_List_const_iterator<int>)&reversed_values;
  local_20.current._M_node =
       (_List_const_iterator<int>)
       (_List_const_iterator<int>)
       reversed_values.container.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
       super__List_node_base._M_next;
  gtest_ar_.success_ =
       std::
       equal<std::reverse_iterator<std::_List_const_iterator<int>>,std::_List_const_iterator<int>>
                 (&local_18,&local_20,
                  (_List_const_iterator<int>)
                  expecting.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                  super__List_node_base._M_next,(_List_node_base *)&expecting);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&gtest_ar_,
               (AssertionResult *)
               "std::equal(std::cbegin(reversed_values), std::cend(reversed_values), std::cbegin(expecting), std::cend(expecting))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/reversed_tests.cpp"
               ,0x53,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    std::__cxx11::string::~string((string *)&local_68);
    if (local_a0.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_a0.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            (&expecting.super__List_base<int,_std::allocator<int>_>);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            ((_List_base<int,_std::allocator<int>_> *)&reversed_values);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            (&values.super__List_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(omp_reversed, move_case_increase_values) {
  std::list values = {1, 4, 3, 2, 5};

  auto reversed_values = omp::reversed(std::move(values));

  std::list expecting = {6, 3, 4, 5, 2};

  for (auto &v : reversed_values)
    ++v;

  ASSERT_TRUE(std::equal(std::cbegin(reversed_values),
                         std::cend(reversed_values), std::cbegin(expecting),
                         std::cend(expecting)));
}